

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

void __thiscall QPainter::setPen(QPainter *this,QColor *color)

{
  uint *puVar1;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var2;
  QColor rhs;
  QColor color_00;
  bool bVar3;
  long in_FS_OFFSET;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &((_Var2._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    setPen();
  }
  else {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    if (color->cspec == Invalid) {
      QColor::QColor((QColor *)&local_28,black);
    }
    else {
      local_28 = *(undefined1 **)color;
      puStack_20 = *(undefined1 **)((long)&color->ct + 4);
    }
    rhs._8_8_ = puStack_20;
    rhs._0_8_ = local_28;
    bVar3 = QPen::doCompareEqualColor((QPen *)((long)((_Var2._M_head_impl)->state)._M_t + 0x40),rhs)
    ;
    if (!bVar3) {
      color_00._8_8_ = puStack_20;
      color_00._0_8_ = local_28;
      QPen::operator=((QPen *)((long)((_Var2._M_head_impl)->state)._M_t + 0x40),color_00);
      if ((_Var2._M_head_impl)->extended == (QPaintEngineEx *)0x0) {
        puVar1 = (uint *)((long)((_Var2._M_head_impl)->state)._M_t + 8);
        *puVar1 = *puVar1 | 1;
      }
      else {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->extended->super_QPaintEngine + 0x108))();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::setPen(const QColor &color)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::setPen(), color=%04x\n", color.rgb());
#endif
    Q_D(QPainter);
    if (!d->engine) {
        qWarning("QPainter::setPen: Painter not active");
        return;
    }

    const QColor actualColor = color.isValid() ? color : QColor(Qt::black);
    if (d->state->pen == actualColor)
        return;

    d->state->pen = actualColor;
    if (d->extended)
        d->extended->penChanged();
    else
        d->state->dirtyFlags |= QPaintEngine::DirtyPen;
}